

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

PCRE2_SPTR16
compile_char1_matchingpath
          (compiler_common *common,PCRE2_UCHAR16 type,PCRE2_SPTR16 cc,jump_list **backtracks,
          BOOL check_str_ptr)

{
  ushort *puVar1;
  ushort *puVar2;
  long lVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  BOOL BVar7;
  jump_list *list_item;
  ushort *puVar8;
  PCRE2_SPTR16 pPVar9;
  sljit_jump *psVar10;
  sljit_u8 *psVar11;
  sljit_sw src2w;
  sljit_jump *psVar12;
  jump_list *pjVar13;
  compare_context *pcVar14;
  sljit_label *psVar15;
  byte *pbVar16;
  sljit_jump *psVar17;
  undefined8 *puVar18;
  uint *puVar19;
  ulong uVar20;
  jump_list **ppjVar21;
  PCRE2_SPTR16 extraout_RDX;
  PCRE2_SPTR16 extraout_RDX_00;
  PCRE2_SPTR16 extraout_RDX_01;
  PCRE2_SPTR16 extraout_RDX_02;
  PCRE2_SPTR16 extraout_RDX_03;
  PCRE2_SPTR16 extraout_RDX_04;
  PCRE2_SPTR16 extraout_RDX_05;
  compare_context *backtracks_00;
  ulong uVar22;
  ulong uVar23;
  sljit_u32 min;
  sljit_s32 sVar24;
  undefined6 in_register_00000032;
  jump_list **ppjVar25;
  int iVar26;
  compiler_common *pcVar27;
  compare_context *backtracks_01;
  ulong uVar28;
  int iVar29;
  long *plVar30;
  compiler_common *common_00;
  bool bVar31;
  ushort *local_70;
  ulong local_68;
  compare_context context;
  
  backtracks_01 = (compare_context *)(ulong)(uint)check_str_ptr;
  min = (sljit_u32)CONCAT62(in_register_00000032,type);
  common_00 = (compiler_common *)common->compiler;
  puVar19 = &switchD_0011011e::switchdataD_001ebb48;
  BVar7 = 0x1ebb48;
  switch(min) {
  case 6:
  case 7:
    if (check_str_ptr != 0) {
      ppjVar21 = backtracks;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
    }
    read_char8_type(common,min);
    if (*(int *)&common_00->compiler == 0) {
      *(sljit_s32 *)&common_00->fcc = 0;
      psVar11 = emit_x86_instruction((sljit_compiler *)common_00,1,0x40,4,1,0);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 0xf7;
      }
    }
    bVar31 = type == 7;
    goto LAB_00110555;
  case 8:
  case 9:
    if (check_str_ptr != 0) {
      ppjVar21 = backtracks;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
    }
    read_char8_type(common,min);
    if (*(int *)&common_00->compiler == 0) {
      *(sljit_s32 *)&common_00->fcc = 0;
      psVar11 = emit_x86_instruction((sljit_compiler *)common_00,1,0x40,1,1,0);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 0xf7;
      }
    }
    bVar31 = type == 9;
    goto LAB_00110555;
  case 10:
  case 0xb:
    if (check_str_ptr != 0) {
      ppjVar21 = backtracks;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
    }
    read_char8_type(common,min);
    if (*(int *)&common_00->compiler == 0) {
      *(sljit_s32 *)&common_00->fcc = 0;
      psVar11 = emit_x86_instruction((sljit_compiler *)common_00,1,0x40,0x10,1,0);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 0xf7;
      }
    }
    bVar31 = type == 0xb;
LAB_00110555:
    psVar12 = sljit_emit_jump((sljit_compiler *)common_00,(uint)!bVar31);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = *backtracks;
      pjVar13->jump = psVar12;
      *backtracks = pjVar13;
    }
    break;
  case 0xc:
    pPVar9 = cc;
    pcVar27 = common_00;
    if (check_str_ptr != 0) {
      ppjVar21 = backtracks;
      BVar7 = 0x1ebb48;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
      pcVar27 = (compiler_common *)common->compiler;
      pPVar9 = extraout_RDX_03;
    }
    read_char_range(pcVar27,min,(sljit_u32)pPVar9,BVar7);
    if ((common->nltype != 0) || (common->newline < 0x100)) {
      check_newlinechar(common,common->nltype,backtracks,1);
      return cc;
    }
    psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,1,1,0,0x40,
                             (ulong)((uint)common->newline >> 8 & 0xff));
    context.length = 0;
    context.sourcereg = 0;
    if (common->mode == 4) {
      check_str_end(common,(jump_list **)&context);
LAB_00110e91:
      if (*(int *)&common_00->compiler == 0) {
        *(sljit_s32 *)&common_00->fcc = 0;
        psVar11 = emit_x86_instruction((sljit_compiler *)common_00,2,1,0,0x82,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          psVar11[0] = '\x0f';
          psVar11[1] = 0xb7;
        }
      }
    }
    else {
      psVar17 = sljit_emit_cmp((sljit_compiler *)common_00,3,2,0,0xd,0);
      if (*(int *)&common_00->compiler == 0) {
        puVar18 = (undefined8 *)ensure_abuf((sljit_compiler *)common_00,0x10);
        if (puVar18 != (undefined8 *)0x0) {
          puVar18[1] = 0;
          *puVar18 = psVar17;
          context._0_8_ = puVar18;
        }
        goto LAB_00110e91;
      }
    }
    psVar17 = sljit_emit_cmp((sljit_compiler *)common_00,0,1,0,0x40,(ulong)(byte)common->newline);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = *backtracks;
      pjVar13->jump = psVar17;
      *backtracks = pjVar13;
    }
    plVar30 = (long *)context._0_8_;
    psVar15 = sljit_emit_label((sljit_compiler *)common_00);
    for (; plVar30 != (long *)0x0; plVar30 = (long *)plVar30[1]) {
      if ((psVar15 != (sljit_label *)0x0) && (lVar3 = *plVar30, lVar3 != 0)) {
        *(ulong *)(lVar3 + 0x10) = (*(ulong *)(lVar3 + 0x10) & 0xfffffffffffffffc) + 1;
        *(sljit_label **)(lVar3 + 0x18) = psVar15;
      }
    }
    psVar15 = sljit_emit_label((sljit_compiler *)common_00);
    if ((psVar12 != (sljit_jump *)0x0) && (psVar15 != (sljit_label *)0x0)) {
      psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
      (psVar12->u).label = psVar15;
    }
    break;
  case 0xd:
  case 0xe:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    sljit_emit_op2((sljit_compiler *)common_00,0x60,2,0,2,0,0x40,2);
    break;
  case 0xf:
  case 0x10:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
    break;
  case 0x11:
    pPVar9 = cc;
    pcVar27 = common_00;
    if (check_str_ptr != 0) {
      ppjVar21 = backtracks;
      BVar7 = 0x1ebb48;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
      pcVar27 = (compiler_common *)common->compiler;
      pPVar9 = extraout_RDX_04;
    }
    read_char_range(pcVar27,min,(sljit_u32)pPVar9,BVar7);
    psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,1,1,0,0x40,0xd);
    context.length = 0;
    context.sourcereg = 0;
    if (common->mode == 4) {
      check_str_end(common,(jump_list **)&context);
LAB_0011091d:
      if (*(int *)&common_00->compiler == 0) {
        *(sljit_s32 *)&common_00->fcc = 0;
        psVar11 = emit_x86_instruction((sljit_compiler *)common_00,2,1,0,0x82,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          psVar11[0] = '\x0f';
          psVar11[1] = 0xb7;
        }
      }
    }
    else {
      psVar17 = sljit_emit_cmp((sljit_compiler *)common_00,3,2,0,0xd,0);
      if (*(int *)&common_00->compiler == 0) {
        puVar18 = (undefined8 *)ensure_abuf((sljit_compiler *)common_00,0x10);
        if (puVar18 != (undefined8 *)0x0) {
          puVar18[1] = 0;
          *puVar18 = psVar17;
          context._0_8_ = puVar18;
        }
        goto LAB_0011091d;
      }
    }
    psVar17 = sljit_emit_cmp((sljit_compiler *)common_00,1,1,0,0x40,10);
    sljit_emit_op2((sljit_compiler *)common_00,0x60,2,0,2,0,0x40,2);
    psVar10 = sljit_emit_jump((sljit_compiler *)common_00,0x18);
    psVar15 = sljit_emit_label((sljit_compiler *)common_00);
    if ((psVar12 != (sljit_jump *)0x0) && (psVar15 != (sljit_label *)0x0)) {
      psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
      (psVar12->u).label = psVar15;
    }
    check_newlinechar(common,common->bsr_nltype,backtracks,0);
    plVar30 = (long *)context._0_8_;
    psVar15 = sljit_emit_label((sljit_compiler *)common_00);
    for (; plVar30 != (long *)0x0; plVar30 = (long *)plVar30[1]) {
      if ((psVar15 != (sljit_label *)0x0) && (lVar3 = *plVar30, lVar3 != 0)) {
        *(ulong *)(lVar3 + 0x10) = (*(ulong *)(lVar3 + 0x10) & 0xfffffffffffffffc) + 1;
        *(sljit_label **)(lVar3 + 0x18) = psVar15;
      }
    }
    psVar15 = sljit_emit_label((sljit_compiler *)common_00);
    if ((psVar17 != (sljit_jump *)0x0) && (psVar15 != (sljit_label *)0x0)) {
      psVar17->flags = (psVar17->flags & 0xfffffffffffffffcU) + 1;
      (psVar17->u).label = psVar15;
    }
    psVar15 = sljit_emit_label((sljit_compiler *)common_00);
    if ((psVar10 != (sljit_jump *)0x0) && (psVar15 != (sljit_label *)0x0)) {
      psVar10->flags = (psVar10->flags & 0xfffffffffffffffcU) + 1;
      (psVar10->u).label = psVar15;
    }
    break;
  case 0x12:
  case 0x13:
    pPVar9 = cc;
    pcVar27 = common_00;
    if (check_str_ptr != 0) {
      ppjVar21 = backtracks;
      BVar7 = 0x1ebb48;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
      pcVar27 = (compiler_common *)common->compiler;
      pPVar9 = extraout_RDX_01;
    }
    uVar6 = (uint)(type == 0x12);
    read_char_range(pcVar27,min,(sljit_u32)pPVar9,BVar7);
    psVar12 = sljit_emit_jump((sljit_compiler *)common_00,0x19);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = common->hspace;
      pjVar13->jump = psVar12;
      common->hspace = pjVar13;
    }
    goto LAB_001105fe;
  case 0x14:
  case 0x15:
    pPVar9 = cc;
    pcVar27 = common_00;
    if (check_str_ptr != 0) {
      ppjVar21 = backtracks;
      BVar7 = 0x1ebb48;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
      pcVar27 = (compiler_common *)common->compiler;
      pPVar9 = extraout_RDX;
    }
    uVar6 = (uint)(type == 0x14);
    read_char_range(pcVar27,min,(sljit_u32)pPVar9,BVar7);
    psVar12 = sljit_emit_jump((sljit_compiler *)common_00,0x19);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = common->vspace;
      pjVar13->jump = psVar12;
      common->vspace = pjVar13;
    }
LAB_001105fe:
    psVar12 = sljit_emit_jump((sljit_compiler *)common_00,uVar6);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = *backtracks;
      pjVar13->jump = psVar12;
      *backtracks = pjVar13;
    }
    break;
  case 0x1d:
  case 0x1e:
    if ((check_str_ptr == 0) || (common->mode != 1)) {
      pPVar9 = cc;
      if (check_str_ptr != 0) goto LAB_00110775;
    }
    else {
      if (type == 0x1d) {
LAB_001103b1:
        sljit_emit_op2((sljit_compiler *)common_00,0x60,2,0,2,0,0x40,2);
        psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,4,2,0,0xd,0);
        if ((*(int *)&common_00->compiler == 0) &&
           (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
           pjVar13 != (jump_list *)0x0)) {
          pjVar13->next = *backtracks;
          pjVar13->jump = psVar12;
          *backtracks = pjVar13;
        }
        context.length = 2;
        context.sourcereg = -1;
        context.ucharptr = 0;
        pPVar9 = byte_sequence_compare(common,(uint)(type == 0x1e),cc,&context,backtracks);
        return pPVar9;
      }
      uVar5 = *cc;
      if ((0xff < (ulong)uVar5) || (uVar5 == common->fcc[uVar5])) goto LAB_001103b1;
      uVar4 = common->fcc[uVar5] ^ uVar5;
      if (uVar5 < 0x80 && uVar4 == 0x20) goto LAB_001103b1;
      uVar6 = (uint)uVar4 - (uVar4 >> 1 & 0x5555);
      uVar6 = (uVar6 >> 2 & 0x3333) + (uVar6 & 0x3333);
      uVar6 = (uVar6 >> 4) + uVar6 & 0xf0f;
      puVar19 = (uint *)(ulong)uVar6;
      if (((short)(uVar6 >> 8) + (short)uVar6 & 0xffU) < 2) goto LAB_001103b1;
LAB_00110775:
      ppjVar21 = backtracks;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
      pPVar9 = extraout_RDX_05;
    }
    uVar5 = *cc;
    BVar7 = (BOOL)CONCAT71((int7)((ulong)puVar19 >> 8),uVar5 < 0x100);
    if (type == 0x1d || uVar5 >= 0x100) {
      pcVar27 = (compiler_common *)common->compiler;
LAB_00110894:
      read_char_range(pcVar27,min,(sljit_u32)pPVar9,BVar7);
      sVar24 = 1;
LAB_001108a5:
      uVar23 = (ulong)uVar5;
      goto LAB_001108aa;
    }
    pcVar27 = (compiler_common *)common->compiler;
    uVar4 = (ushort)common->fcc[uVar5];
    if (uVar5 == uVar4) goto LAB_00110894;
    read_char_range(pcVar27,min,(sljit_u32)pPVar9,BVar7);
    uVar6 = (uint)(uVar4 ^ uVar5);
    if ((uVar6 & uVar6 - 1) == 0) {
      if (*(int *)&common_00->compiler == 0) {
        *(sljit_s32 *)&common_00->fcc = 0;
        emit_cum_binary((sljit_compiler *)common_00,0xd0b0908,1,0,1,0,0x40,(ulong)uVar6);
      }
      uVar4 = uVar4 | uVar5;
      sVar24 = 1;
LAB_00110e4a:
      uVar23 = (ulong)uVar4;
      goto LAB_001108aa;
    }
    psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,0,1,0,0x40,(ulong)uVar5);
    psVar17 = sljit_emit_cmp((sljit_compiler *)common_00,1,1,0,0x40,(ulong)uVar4);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = *backtracks;
      pjVar13->jump = psVar17;
      *backtracks = pjVar13;
    }
    psVar15 = sljit_emit_label((sljit_compiler *)common_00);
    if ((psVar12 != (sljit_jump *)0x0) && (psVar15 != (sljit_label *)0x0)) {
      psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
      (psVar12->u).label = psVar15;
    }
    goto LAB_001108d7;
  case 0x1f:
  case 0x20:
    pPVar9 = cc;
    if (check_str_ptr != 0) {
      ppjVar21 = backtracks;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar21;
      pPVar9 = extraout_RDX_00;
    }
    uVar5 = *cc;
    BVar7 = (BOOL)CONCAT71((int7)((ulong)puVar19 >> 8),uVar5 < 0x100);
    if (type == 0x1f || uVar5 >= 0x100) {
      pcVar27 = (compiler_common *)common->compiler;
LAB_00110867:
      read_char_range(pcVar27,min,(sljit_u32)pPVar9,BVar7);
      sVar24 = 0;
      goto LAB_001108a5;
    }
    pcVar27 = (compiler_common *)common->compiler;
    uVar4 = (ushort)common->fcc[uVar5];
    if (uVar5 == uVar4) goto LAB_00110867;
    read_char_range(pcVar27,min,(sljit_u32)pPVar9,BVar7);
    uVar6 = (uint)(uVar4 ^ uVar5);
    if ((uVar6 & uVar6 - 1) == 0) {
      if (*(int *)&common_00->compiler == 0) {
        *(sljit_s32 *)&common_00->fcc = 0;
        emit_cum_binary((sljit_compiler *)common_00,0xd0b0908,1,0,1,0,0x40,(ulong)uVar6);
      }
      uVar4 = uVar4 | uVar5;
      sVar24 = 0;
      goto LAB_00110e4a;
    }
    psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,0,1,0,0x40,(ulong)uVar5);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = *backtracks;
      pjVar13->jump = psVar12;
      *backtracks = pjVar13;
    }
    uVar23 = (ulong)uVar4;
    sVar24 = 0;
LAB_001108aa:
    psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,sVar24,1,0,0x40,uVar23);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = *backtracks;
      pjVar13->jump = psVar12;
      *backtracks = pjVar13;
    }
LAB_001108d7:
    cc = cc + 1;
    break;
  default:
    if (1 < min - 0x6e) {
      if (min != 0x70) {
        return cc;
      }
      if (check_str_ptr != 0) {
        detect_partial_match(common,backtracks);
        common_00 = (compiler_common *)common->compiler;
      }
      context.length = 0;
      context.sourcereg = 0;
      uVar5 = cc[1];
      backtracks_00 = (compare_context *)backtracks;
      if ((uVar5 & 1) == 0) {
        backtracks_00 = &context;
      }
      local_70 = cc + 2;
      uVar28 = 0;
      bVar31 = (uVar5 & 2) != 0;
      uVar23 = 0x7fffffff;
      if (bVar31) {
        uVar23 = uVar28;
      }
      puVar1 = cc + 0x12;
      puVar8 = puVar1;
      if (!bVar31) {
        puVar8 = local_70;
      }
      uVar5 = *(ushort *)((long)cc + (ulong)((uVar5 & 2) << 4) + 4);
      uVar6 = (uint)uVar5;
      uVar22 = 0x100;
      if (uVar5 != 0) {
        uVar28 = 0;
        do {
          if ((short)uVar6 == 2) {
            if (puVar8[1] <= uVar23) {
              uVar23 = (ulong)puVar8[1];
            }
            puVar2 = puVar8 + 2;
            puVar8 = puVar8 + 3;
            if (uVar22 <= *puVar2) {
              uVar22 = (ulong)*puVar2;
            }
          }
          else if (uVar6 == 1) {
            uVar20 = (ulong)puVar8[1];
            puVar8 = puVar8 + 2;
            if (uVar22 <= uVar20) {
              uVar22 = uVar20;
            }
            if (uVar20 <= uVar23) {
              uVar23 = uVar20;
            }
          }
          uVar6 = (uint)*puVar8;
          uVar28 = (ulong)((int)uVar28 + 1);
        } while (*puVar8 != 0);
      }
      read_char_range(common_00,(sljit_u32)local_70,(sljit_u32)puVar1,uVar6);
      uVar5 = cc[1];
      if ((uVar5 & 4) == 0) {
        if ((uVar5 & 2) == 0) {
          sljit_emit_op2((sljit_compiler *)common_00,0x62,4,0,1,0,0x40,uVar23);
          pcVar14 = &context;
          if ((cc[1] & 1) == 0) {
            pcVar14 = (compare_context *)backtracks;
          }
          backtracks_01 = (compare_context *)0x40;
          psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,4,4,0,0x40,uVar22 - uVar23);
          if ((*(int *)&common_00->compiler == 0) &&
             (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
             pjVar13 != (jump_list *)0x0)) {
            pjVar13->next = *(jump_list **)pcVar14;
            pjVar13->jump = psVar12;
            *(jump_list **)pcVar14 = pjVar13;
          }
        }
        else {
          psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,4,1,0,0x40,0xff);
          backtracks_01 = &context;
          BVar7 = optimize_class(common,(sljit_u8 *)local_70,(uint)(*(byte *)((long)cc + 0x23) >> 7)
                                 ,1,(jump_list **)backtracks_01);
          if (BVar7 == 0) {
            if (*(int *)&common_00->compiler == 0) {
              *(undefined4 *)&common_00->fcc = 0;
              backtracks_01 = (compare_context *)&DAT_00000001;
              emit_cum_binary((sljit_compiler *)common_00,0x25232120,4,0,1,0,0x40,7);
              if (*(int *)&common_00->compiler == 0) {
                *(undefined4 *)&common_00->fcc = 0;
                backtracks_01 = (compare_context *)&DAT_00000001;
                pbVar16 = emit_x86_instruction((sljit_compiler *)common_00,0x21,0x40,3,1,0);
                if (pbVar16 != (byte *)0x0) {
                  *pbVar16 = *pbVar16 | 0x28;
                }
                if (*(int *)&common_00->compiler == 0) {
                  *(undefined4 *)&common_00->fcc = 0;
                  backtracks_01 = (compare_context *)0x81;
                  psVar11 = emit_x86_instruction
                                      ((sljit_compiler *)common_00,2,1,0,0x81,(sljit_sw)local_70);
                  if (psVar11 != (sljit_u8 *)0x0) {
                    psVar11[0] = '\x0f';
                    psVar11[1] = 0xb6;
                  }
                  if (*(int *)&common_00->compiler == 0) {
                    *(undefined4 *)&common_00->fcc = 0;
                    backtracks_01 = (compare_context *)0x40;
                    emit_shift((sljit_compiler *)common_00,' ',4,0,0x40,1,4,0);
                    if (*(int *)&common_00->compiler == 0) {
                      *(undefined4 *)&common_00->fcc = 0;
                      backtracks_01 = (compare_context *)0x4;
                      psVar11 = emit_x86_instruction((sljit_compiler *)common_00,1,1,0,4,0);
                      if (psVar11 != (sljit_u8 *)0x0) {
                        *psVar11 = 0x85;
                      }
                    }
                  }
                }
              }
            }
            psVar17 = sljit_emit_jump((sljit_compiler *)common_00,1);
            if ((*(int *)&common_00->compiler == 0) &&
               (puVar18 = (undefined8 *)ensure_abuf((sljit_compiler *)common_00,0x10),
               puVar18 != (undefined8 *)0x0)) {
              puVar18[1] = context._0_8_;
              *puVar18 = psVar17;
              context._0_8_ = puVar18;
            }
          }
          psVar17 = sljit_emit_jump((sljit_compiler *)common_00,0x18);
          if ((*(int *)&common_00->compiler == 0) &&
             (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
             pjVar13 != (jump_list *)0x0)) {
            pjVar13->next = *backtracks;
            pjVar13->jump = psVar17;
            *backtracks = pjVar13;
          }
          psVar15 = sljit_emit_label((sljit_compiler *)common_00);
          local_70 = puVar1;
          if ((psVar12 != (sljit_jump *)0x0) && (psVar15 != (sljit_label *)0x0)) {
            psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
            (psVar12->u).label = psVar15;
          }
        }
      }
      else if ((uVar5 & 2) != 0) {
        if (*(int *)&common_00->compiler == 0) {
          *(undefined4 *)&common_00->fcc = 0;
          psVar11 = emit_x86_instruction((sljit_compiler *)common_00,1,1,0,5,0);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x89;
          }
        }
        backtracks_01 = backtracks_00;
        BVar7 = optimize_class(common,(sljit_u8 *)local_70,0,1,(jump_list **)backtracks_00);
        if (BVar7 == 0) {
          backtracks_01 = (compare_context *)0x40;
          psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,4,1,0,0x40,0xff);
          if (*(int *)&common_00->compiler == 0) {
            *(undefined4 *)&common_00->fcc = 0;
            backtracks_01 = (compare_context *)&DAT_00000001;
            emit_cum_binary((sljit_compiler *)common_00,0x25232120,4,0,1,0,0x40,7);
            if (*(int *)&common_00->compiler == 0) {
              *(undefined4 *)&common_00->fcc = 0;
              backtracks_01 = (compare_context *)&DAT_00000001;
              pbVar16 = emit_x86_instruction((sljit_compiler *)common_00,0x21,0x40,3,1,0);
              if (pbVar16 != (byte *)0x0) {
                *pbVar16 = *pbVar16 | 0x28;
              }
              if (*(int *)&common_00->compiler == 0) {
                *(undefined4 *)&common_00->fcc = 0;
                backtracks_01 = (compare_context *)0x81;
                psVar11 = emit_x86_instruction
                                    ((sljit_compiler *)common_00,2,1,0,0x81,(sljit_sw)local_70);
                if (psVar11 != (sljit_u8 *)0x0) {
                  psVar11[0] = '\x0f';
                  psVar11[1] = 0xb6;
                }
                if (*(int *)&common_00->compiler == 0) {
                  *(undefined4 *)&common_00->fcc = 0;
                  backtracks_01 = (compare_context *)0x40;
                  emit_shift((sljit_compiler *)common_00,' ',4,0,0x40,1,4,0);
                  if (*(int *)&common_00->compiler == 0) {
                    *(undefined4 *)&common_00->fcc = 0;
                    backtracks_01 = (compare_context *)0x4;
                    psVar11 = emit_x86_instruction((sljit_compiler *)common_00,1,1,0,4,0);
                    if (psVar11 != (sljit_u8 *)0x0) {
                      *psVar11 = 0x85;
                    }
                  }
                }
              }
            }
          }
          psVar17 = sljit_emit_jump((sljit_compiler *)common_00,1);
          if ((*(int *)&common_00->compiler == 0) &&
             (puVar18 = (undefined8 *)ensure_abuf((sljit_compiler *)common_00,0x10),
             puVar18 != (undefined8 *)0x0)) {
            puVar18[1] = *(undefined8 *)backtracks_00;
            *puVar18 = psVar17;
            *(undefined8 **)backtracks_00 = puVar18;
          }
          psVar15 = sljit_emit_label((sljit_compiler *)common_00);
          if ((psVar12 != (sljit_jump *)0x0) && (psVar15 != (sljit_label *)0x0)) {
            psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
            (psVar12->u).label = psVar15;
          }
        }
        local_70 = puVar1;
        if (*(int *)&common_00->compiler == 0) {
          *(undefined4 *)&common_00->fcc = 0;
          backtracks_01 = (compare_context *)&DAT_00000001;
          psVar11 = emit_x86_instruction((sljit_compiler *)common_00,1,5,0,1,0);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x89;
          }
        }
      }
      uVar5 = *local_70;
      if (uVar5 != 0) {
        iVar26 = 0;
        local_68 = 0;
        do {
          iVar29 = (int)uVar28;
          uVar6 = (uint)(iVar29 == 1 && backtracks_00 != (compare_context *)backtracks);
          if (uVar5 == 2) {
            uVar23 = (ulong)local_70[1];
            src2w = local_68 - uVar23;
            if (src2w != 0) {
              if (local_68 < uVar23 || src2w == 0) {
                src2w = uVar23 - local_68;
                sVar24 = 0x62;
              }
              else {
                sVar24 = 0x60;
              }
              backtracks_01 = (compare_context *)&DAT_00000001;
              sljit_emit_op2((sljit_compiler *)common_00,sVar24,1,0,1,0,0x40,src2w);
            }
            uVar28 = (ulong)local_70[2];
            local_70 = local_70 + 3;
            local_68 = uVar23;
            if (iVar26 < 3) {
              if ((ushort)(*local_70 - 1) < 2) {
                if (*(int *)&common_00->compiler == 0) {
                  backtracks_01 = (compare_context *)(uVar28 - uVar23);
                  *(undefined4 *)&common_00->fcc = 0;
                  emit_cmp_binary((sljit_compiler *)common_00,1,0,0x40,(sljit_sw)backtracks_01);
                }
                sVar24 = 0x66;
                if (iVar26 == 0) {
                  sVar24 = 0x20;
                }
                sljit_emit_op_flags((sljit_compiler *)common_00,sVar24,4,5,(sljit_s32)backtracks_01)
                ;
                iVar26 = iVar26 + 1;
                goto LAB_00110b26;
              }
              if (0 < iVar26) goto LAB_00110cc8;
              backtracks_01 = (compare_context *)0x40;
              psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,uVar6 ^ 5,1,0,0x40,
                                       uVar28 - uVar23);
            }
            else {
LAB_00110cc8:
              if (*(int *)&common_00->compiler == 0) {
                backtracks_01 = (compare_context *)(uVar28 - uVar23);
                *(undefined4 *)&common_00->fcc = 0;
                emit_cmp_binary((sljit_compiler *)common_00,1,0,0x40,(sljit_sw)backtracks_01);
              }
              sljit_emit_op_flags((sljit_compiler *)common_00,0x266,4,5,(sljit_s32)backtracks_01);
              psVar12 = sljit_emit_jump((sljit_compiler *)common_00,uVar6 ^ 1);
            }
LAB_00110d1b:
            iVar26 = 0;
            if (psVar12 != (sljit_jump *)0x0) {
              pcVar14 = (compare_context *)backtracks;
              if (1 < iVar29) {
                pcVar14 = backtracks_00;
              }
              if ((*(int *)&common_00->compiler == 0) &&
                 (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
                 pjVar13 != (jump_list *)0x0)) {
                pjVar13->next = *(jump_list **)pcVar14;
                pjVar13->jump = psVar12;
                *(jump_list **)pcVar14 = pjVar13;
              }
              iVar26 = 0;
            }
          }
          else if (uVar5 == 1) {
            uVar23 = (ulong)local_70[1];
            local_70 = local_70 + 2;
            if (iVar26 < 3) {
              if ((ushort)(*local_70 - 1) < 2) {
                if (*(int *)&common_00->compiler == 0) {
                  backtracks_01 = (compare_context *)(uVar23 - local_68);
                  *(undefined4 *)&common_00->fcc = 0;
                  emit_cmp_binary((sljit_compiler *)common_00,1,0,0x40,(sljit_sw)backtracks_01);
                }
                sVar24 = 0x66;
                if (iVar26 == 0) {
                  sVar24 = 0x20;
                }
                sljit_emit_op_flags((sljit_compiler *)common_00,sVar24,4,0,(sljit_s32)backtracks_01)
                ;
                iVar26 = iVar26 + 1;
                goto LAB_00110b26;
              }
              if (iVar26 < 1) {
                backtracks_01 = (compare_context *)0x40;
                psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,uVar6,1,0,0x40,
                                         uVar23 - local_68);
                goto LAB_00110d1b;
              }
            }
            if (*(int *)&common_00->compiler == 0) {
              backtracks_01 = (compare_context *)(uVar23 - local_68);
              *(undefined4 *)&common_00->fcc = 0;
              emit_cmp_binary((sljit_compiler *)common_00,1,0,0x40,(sljit_sw)backtracks_01);
            }
            sljit_emit_op_flags((sljit_compiler *)common_00,0x266,4,0,(sljit_s32)backtracks_01);
            psVar12 = sljit_emit_jump((sljit_compiler *)common_00,uVar6 ^ 1);
            goto LAB_00110d1b;
          }
LAB_00110b26:
          uVar5 = *local_70;
          uVar28 = (ulong)(iVar29 - 1);
        } while (uVar5 != 0);
      }
      plVar30 = (long *)context._0_8_;
      if (context._0_8_ != 0) {
        psVar15 = sljit_emit_label((sljit_compiler *)common_00);
        do {
          if ((psVar15 != (sljit_label *)0x0) && (lVar3 = *plVar30, lVar3 != 0)) {
            *(ulong *)(lVar3 + 0x10) = (*(ulong *)(lVar3 + 0x10) & 0xfffffffffffffffc) + 1;
            *(sljit_label **)(lVar3 + 0x18) = psVar15;
          }
          plVar30 = (long *)plVar30[1];
        } while (plVar30 != (long *)0x0);
      }
      return cc + ((ulong)*cc - 1);
    }
    ppjVar21 = backtracks;
    pPVar9 = cc;
    pcVar27 = common_00;
    if (check_str_ptr != 0) {
      ppjVar25 = backtracks;
      detect_partial_match(common,backtracks);
      min = (sljit_u32)ppjVar25;
      pcVar27 = (compiler_common *)common->compiler;
      pPVar9 = extraout_RDX_02;
    }
    read_char_range(pcVar27,min,(sljit_u32)pPVar9,(BOOL)ppjVar21);
    BVar7 = optimize_class(common,(sljit_u8 *)cc,(uint)(type == 0x6f),0,backtracks);
    if (BVar7 != 0) {
      return cc + 0x10;
    }
    psVar12 = sljit_emit_cmp((sljit_compiler *)common_00,4,1,0,0x40,0xff);
    if (type == 0x6e) {
      if (*(int *)&common_00->compiler == 0) {
        pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10);
        if (pjVar13 != (jump_list *)0x0) {
          pjVar13->next = *backtracks;
          pjVar13->jump = psVar12;
          *backtracks = pjVar13;
        }
        psVar12 = (sljit_jump *)0x0;
        goto LAB_0011102c;
      }
      psVar12 = (sljit_jump *)0x0;
    }
    else {
LAB_0011102c:
      if (*(int *)&common_00->compiler == 0) {
        *(sljit_s32 *)&common_00->fcc = 0;
        emit_cum_binary((sljit_compiler *)common_00,0x25232120,4,0,1,0,0x40,7);
        if (*(int *)&common_00->compiler == 0) {
          *(sljit_s32 *)&common_00->fcc = 0;
          pbVar16 = emit_x86_instruction((sljit_compiler *)common_00,0x21,0x40,3,1,0);
          if (pbVar16 != (byte *)0x0) {
            *pbVar16 = *pbVar16 | 0x28;
          }
          if (*(int *)&common_00->compiler == 0) {
            *(sljit_s32 *)&common_00->fcc = 0;
            psVar11 = emit_x86_instruction((sljit_compiler *)common_00,2,1,0,0x81,(sljit_sw)cc);
            if (psVar11 != (sljit_u8 *)0x0) {
              psVar11[0] = '\x0f';
              psVar11[1] = 0xb6;
            }
            if (*(int *)&common_00->compiler == 0) {
              *(sljit_s32 *)&common_00->fcc = 0;
              emit_shift((sljit_compiler *)common_00,' ',4,0,0x40,1,4,0);
              if (*(int *)&common_00->compiler == 0) {
                *(sljit_s32 *)&common_00->fcc = 0;
                psVar11 = emit_x86_instruction((sljit_compiler *)common_00,1,1,0,4,0);
                if (psVar11 != (sljit_u8 *)0x0) {
                  *psVar11 = 0x85;
                }
              }
            }
          }
        }
      }
    }
    psVar17 = sljit_emit_jump((sljit_compiler *)common_00,0);
    if ((*(int *)&common_00->compiler == 0) &&
       (pjVar13 = (jump_list *)ensure_abuf((sljit_compiler *)common_00,0x10),
       pjVar13 != (jump_list *)0x0)) {
      pjVar13->next = *backtracks;
      pjVar13->jump = psVar17;
      *backtracks = pjVar13;
    }
    if ((psVar12 != (sljit_jump *)0x0) &&
       (psVar15 = sljit_emit_label((sljit_compiler *)common_00), psVar15 != (sljit_label *)0x0)) {
      psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
      (psVar12->u).label = psVar15;
    }
    cc = cc + 0x10;
  }
  return cc;
}

Assistant:

static PCRE2_SPTR compile_char1_matchingpath(compiler_common *common, PCRE2_UCHAR type, PCRE2_SPTR cc, jump_list **backtracks, BOOL check_str_ptr)
{
DEFINE_COMPILER;
int length;
unsigned int c, oc, bit;
compare_context context;
struct sljit_jump *jump[3];
jump_list *end_list;
#ifdef SUPPORT_UNICODE
PCRE2_UCHAR propdata[5];
#endif /* SUPPORT_UNICODE */

switch(type)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  /* Digits are usually 0-9, so it is worth to optimize them. */
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  if (common->utf && is_char7_bitset((const sljit_u8*)common->ctypes - cbit_length + cbit_digit, FALSE))
    read_char7_type(common, type == OP_NOT_DIGIT);
  else
#endif
    read_char8_type(common, type == OP_NOT_DIGIT);
    /* Flip the starting bit in the negative case. */
  OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, ctype_digit);
  add_jump(compiler, backtracks, JUMP(type == OP_DIGIT ? SLJIT_ZERO : SLJIT_NOT_ZERO));
  return cc;

  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  if (common->utf && is_char7_bitset((const sljit_u8*)common->ctypes - cbit_length + cbit_space, FALSE))
    read_char7_type(common, type == OP_NOT_WHITESPACE);
  else
#endif
    read_char8_type(common, type == OP_NOT_WHITESPACE);
  OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, ctype_space);
  add_jump(compiler, backtracks, JUMP(type == OP_WHITESPACE ? SLJIT_ZERO : SLJIT_NOT_ZERO));
  return cc;

  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  if (common->utf && is_char7_bitset((const sljit_u8*)common->ctypes - cbit_length + cbit_word, FALSE))
    read_char7_type(common, type == OP_NOT_WORDCHAR);
  else
#endif
    read_char8_type(common, type == OP_NOT_WORDCHAR);
  OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, ctype_word);
  add_jump(compiler, backtracks, JUMP(type == OP_WORDCHAR ? SLJIT_ZERO : SLJIT_NOT_ZERO));
  return cc;

  case OP_ANY:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  read_char_range(common, common->nlmin, common->nlmax, TRUE);
  if (common->nltype == NLTYPE_FIXED && common->newline > 255)
    {
    jump[0] = CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, (common->newline >> 8) & 0xff);
    end_list = NULL;
    if (common->mode != PCRE2_JIT_PARTIAL_HARD)
      add_jump(compiler, &end_list, CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0));
    else
      check_str_end(common, &end_list);

    OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, common->newline & 0xff));
    set_jumps(end_list, LABEL());
    JUMPHERE(jump[0]);
    }
  else
    check_newlinechar(common, common->nltype, backtracks, TRUE);
  return cc;

  case OP_ALLANY:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH != 32
  if (common->utf)
    {
    OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
    OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
#if PCRE2_CODE_UNIT_WIDTH == 8 || PCRE2_CODE_UNIT_WIDTH == 16
#if PCRE2_CODE_UNIT_WIDTH == 8
    jump[0] = CMP(SLJIT_LESS, TMP1, 0, SLJIT_IMM, 0xc0);
    OP1(SLJIT_MOV_U8, TMP1, 0, SLJIT_MEM1(TMP1), (sljit_sw)PRIV(utf8_table4) - 0xc0);
    OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP1, 0);
#elif PCRE2_CODE_UNIT_WIDTH == 16
    jump[0] = CMP(SLJIT_LESS, TMP1, 0, SLJIT_IMM, 0xd800);
    OP2(SLJIT_AND, TMP1, 0, TMP1, 0, SLJIT_IMM, 0xfc00);
    OP2(SLJIT_SUB | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, 0xd800);
    OP_FLAGS(SLJIT_MOV, TMP1, 0, SLJIT_EQUAL);
    OP2(SLJIT_SHL, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
    OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP1, 0);
#endif
    JUMPHERE(jump[0]);
#endif /* PCRE2_CODE_UNIT_WIDTH == [8|16] */
    return cc;
    }
#endif
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
  return cc;

  case OP_ANYBYTE:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
  return cc;

#ifdef SUPPORT_UNICODE
  case OP_NOTPROP:
  case OP_PROP:
  propdata[0] = XCL_HASPROP;
  propdata[1] = type == OP_NOTPROP ? XCL_NOTPROP : XCL_PROP;
  propdata[2] = cc[0];
  propdata[3] = cc[1];
  propdata[4] = XCL_END;
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  compile_xclass_matchingpath(common, propdata, backtracks);
  return cc + 2;
#endif

  case OP_ANYNL:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  read_char_range(common, common->bsr_nlmin, common->bsr_nlmax, FALSE);
  jump[0] = CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_CR);
  /* We don't need to handle soft partial matching case. */
  end_list = NULL;
  if (common->mode != PCRE2_JIT_PARTIAL_HARD)
    add_jump(compiler, &end_list, CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0));
  else
    check_str_end(common, &end_list);
  OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
  jump[1] = CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_NL);
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
  jump[2] = JUMP(SLJIT_JUMP);
  JUMPHERE(jump[0]);
  check_newlinechar(common, common->bsr_nltype, backtracks, FALSE);
  set_jumps(end_list, LABEL());
  JUMPHERE(jump[1]);
  JUMPHERE(jump[2]);
  return cc;

  case OP_NOT_HSPACE:
  case OP_HSPACE:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  read_char_range(common, 0x9, 0x3000, type == OP_NOT_HSPACE);
  add_jump(compiler, &common->hspace, JUMP(SLJIT_FAST_CALL));
  sljit_set_current_flags(compiler, SLJIT_SET_Z);
  add_jump(compiler, backtracks, JUMP(type == OP_NOT_HSPACE ? SLJIT_NOT_ZERO : SLJIT_ZERO));
  return cc;

  case OP_NOT_VSPACE:
  case OP_VSPACE:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  read_char_range(common, 0xa, 0x2029, type == OP_NOT_VSPACE);
  add_jump(compiler, &common->vspace, JUMP(SLJIT_FAST_CALL));
  sljit_set_current_flags(compiler, SLJIT_SET_Z);
  add_jump(compiler, backtracks, JUMP(type == OP_NOT_VSPACE ? SLJIT_NOT_ZERO : SLJIT_ZERO));
  return cc;

#ifdef SUPPORT_UNICODE
  case OP_EXTUNI:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);

  SLJIT_ASSERT(TMP1 == SLJIT_R0 && STR_PTR == SLJIT_R1);
  OP1(SLJIT_MOV, SLJIT_R0, 0, ARGUMENTS, 0);

#if PCRE2_CODE_UNIT_WIDTH != 32
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW), SLJIT_IMM,
      common->utf ? SLJIT_FUNC_OFFSET(do_extuni_utf) : SLJIT_FUNC_OFFSET(do_extuni_no_utf));
#else
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW), SLJIT_IMM, SLJIT_FUNC_OFFSET(do_extuni_no_utf));
#endif

  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_RETURN_REG, 0);

  if (common->mode == PCRE2_JIT_PARTIAL_HARD)
    {
    jump[0] = CMP(SLJIT_LESS, SLJIT_RETURN_REG, 0, STR_END, 0);
    /* Since we successfully read a char above, partial matching must occure. */
    check_partial(common, TRUE);
    JUMPHERE(jump[0]);
    }
  return cc;
#endif

  case OP_CHAR:
  case OP_CHARI:
  length = 1;
#ifdef SUPPORT_UNICODE
  if (common->utf && HAS_EXTRALEN(*cc)) length += GET_EXTRALEN(*cc);
#endif
  if (common->mode == PCRE2_JIT_COMPLETE && check_str_ptr
      && (type == OP_CHAR || !char_has_othercase(common, cc) || char_get_othercase_bit(common, cc) != 0))
    {
    OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(length));
    add_jump(compiler, backtracks, CMP(SLJIT_GREATER, STR_PTR, 0, STR_END, 0));

    context.length = IN_UCHARS(length);
    context.sourcereg = -1;
#if defined SLJIT_UNALIGNED && SLJIT_UNALIGNED
    context.ucharptr = 0;
#endif
    return byte_sequence_compare(common, type == OP_CHARI, cc, &context, backtracks);
    }

  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#ifdef SUPPORT_UNICODE
  if (common->utf)
    {
    GETCHAR(c, cc);
    }
  else
#endif
    c = *cc;

  if (type == OP_CHAR || !char_has_othercase(common, cc))
    {
    read_char_range(common, c, c, FALSE);
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, c));
    return cc + length;
    }
  oc = char_othercase(common, c);
  read_char_range(common, c < oc ? c : oc, c > oc ? c : oc, FALSE);
  bit = c ^ oc;
  if (is_powerof2(bit))
    {
    OP2(SLJIT_OR, TMP1, 0, TMP1, 0, SLJIT_IMM, bit);
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, c | bit));
    return cc + length;
    }
  jump[0] = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c);
  add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, oc));
  JUMPHERE(jump[0]);
  return cc + length;

  case OP_NOT:
  case OP_NOTI:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);

  length = 1;
#ifdef SUPPORT_UNICODE
  if (common->utf)
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    c = *cc;
    if (c < 128)
      {
      OP1(SLJIT_MOV_U8, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
      if (type == OP_NOT || !char_has_othercase(common, cc))
        add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c));
      else
        {
        /* Since UTF8 code page is fixed, we know that c is in [a-z] or [A-Z] range. */
        OP2(SLJIT_OR, TMP2, 0, TMP1, 0, SLJIT_IMM, 0x20);
        add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP2, 0, SLJIT_IMM, c | 0x20));
        }
      /* Skip the variable-length character. */
      OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
      jump[0] = CMP(SLJIT_LESS, TMP1, 0, SLJIT_IMM, 0xc0);
      OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(TMP1), (sljit_sw)PRIV(utf8_table4) - 0xc0);
      OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP1, 0);
      JUMPHERE(jump[0]);
      return cc + 1;
      }
    else
#endif /* PCRE2_CODE_UNIT_WIDTH == 8 */
      {
      GETCHARLEN(c, cc, length);
      }
    }
  else
#endif /* SUPPORT_UNICODE */
    c = *cc;

  if (type == OP_NOT || !char_has_othercase(common, cc))
    {
    read_char_range(common, c, c, TRUE);
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c));
    }
  else
    {
    oc = char_othercase(common, c);
    read_char_range(common, c < oc ? c : oc, c > oc ? c : oc, TRUE);
    bit = c ^ oc;
    if (is_powerof2(bit))
      {
      OP2(SLJIT_OR, TMP1, 0, TMP1, 0, SLJIT_IMM, bit);
      add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c | bit));
      }
    else
      {
      add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c));
      add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, oc));
      }
    }
  return cc + length;

  case OP_CLASS:
  case OP_NCLASS:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  bit = (common->utf && is_char7_bitset((const sljit_u8 *)cc, type == OP_NCLASS)) ? 127 : 255;
  read_char_range(common, 0, bit, type == OP_NCLASS);
#else
  read_char_range(common, 0, 255, type == OP_NCLASS);
#endif

  if (optimize_class(common, (const sljit_u8 *)cc, type == OP_NCLASS, FALSE, backtracks))
    return cc + 32 / sizeof(PCRE2_UCHAR);

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  jump[0] = NULL;
  if (common->utf)
    {
    jump[0] = CMP(SLJIT_GREATER, TMP1, 0, SLJIT_IMM, bit);
    if (type == OP_CLASS)
      {
      add_jump(compiler, backtracks, jump[0]);
      jump[0] = NULL;
      }
    }
#elif PCRE2_CODE_UNIT_WIDTH != 8
  jump[0] = CMP(SLJIT_GREATER, TMP1, 0, SLJIT_IMM, 255);
  if (type == OP_CLASS)
    {
    add_jump(compiler, backtracks, jump[0]);
    jump[0] = NULL;
    }
#endif /* SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8 */

  OP2(SLJIT_AND, TMP2, 0, TMP1, 0, SLJIT_IMM, 0x7);
  OP2(SLJIT_LSHR, TMP1, 0, TMP1, 0, SLJIT_IMM, 3);
  OP1(SLJIT_MOV_U8, TMP1, 0, SLJIT_MEM1(TMP1), (sljit_sw)cc);
  OP2(SLJIT_SHL, TMP2, 0, SLJIT_IMM, 1, TMP2, 0);
  OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, TMP2, 0);
  add_jump(compiler, backtracks, JUMP(SLJIT_ZERO));

#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
  if (jump[0] != NULL)
    JUMPHERE(jump[0]);
#endif
  return cc + 32 / sizeof(PCRE2_UCHAR);

#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH == 16 || PCRE2_CODE_UNIT_WIDTH == 32
  case OP_XCLASS:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  compile_xclass_matchingpath(common, cc + LINK_SIZE, backtracks);
  return cc + GET(cc, 0) - 1;
#endif
  }
SLJIT_UNREACHABLE();
return cc;
}